

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImRect *pIVar1;
  ImVec2 *pIVar2;
  ImGuiNavLayer IVar3;
  ImGuiID focus_scope_id;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  bool bVar7;
  byte bVar8;
  
  pIVar5 = GImGui;
  if (((uint)window->Flags >> 0x10 & 1) == 0) {
    if (((((uint)window->Flags >> 0x1a & 1) != 0) || (window->RootWindow == window)) ||
       (window->NavLastIds[0] == 0 || force_reinit)) {
      bVar8 = 1;
    }
    else {
      bVar8 = 0;
    }
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n"
               ,(ulong)bVar8,window->Name,(ulong)GImGui->NavLayer);
    }
    pIVar6 = GImGui;
    if (bVar8 != 0) {
      IVar3 = pIVar5->NavLayer;
      focus_scope_id = window->NavRootFocusScopeId;
      GImGui->NavId = 0;
      pIVar6->NavLayer = IVar3;
      SetNavFocusScope(focus_scope_id);
      pIVar4 = pIVar6->NavWindow;
      pIVar4->NavLastIds[IVar3] = 0;
      pIVar1 = pIVar4->NavRectRel + IVar3;
      (pIVar1->Min).x = 0.0;
      (pIVar1->Min).y = 0.0;
      (pIVar1->Max).x = 0.0;
      pIVar6 = GImGui;
      (pIVar1->Max).y = 0.0;
      pIVar2 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
      pIVar2->x = 3.4028235e+38;
      pIVar2->y = 3.4028235e+38;
      pIVar5->NavInitRequest = true;
      pIVar5->NavInitRequestFromMove = false;
      (pIVar5->NavInitResult).ID = 0;
      bVar7 = true;
      if (pIVar6->NavMoveScoringItems == false) {
        bVar7 = pIVar6->NavInitRequest;
      }
      pIVar6->NavAnyRequest = bVar7;
      return;
    }
    pIVar5->NavId = window->NavLastIds[0];
  }
  else {
    GImGui->NavId = 0;
  }
  SetNavFocusScope(window->NavRootFocusScopeId);
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = 0;
        SetNavFocusScope(window->NavRootFocusScopeId);
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, window->NavRootFocusScopeId, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResult.ID = 0;
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        SetNavFocusScope(window->NavRootFocusScopeId);
    }
}